

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C++20Support.hpp
# Opt level: O3

string * webfront::http::std::format<int>(string *__return_storage_ptr__,string_view fmt,int *ts)

{
  char *pcVar1;
  char *pcVar2;
  ostream *this;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> fragments;
  stringstream ss;
  size_t asStack_3c0 [2];
  char *local_3b0;
  long alStack_3a8 [62];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar3 = fmt._M_str;
  sVar6 = fmt._M_len;
  uVar5 = 0;
  asStack_3c0[0] = 0x115c86;
  memset(asStack_3c0 + 1,0,0x200);
  pcVar2 = pcVar3;
  if (sVar6 != 0) {
    sVar4 = 0;
    uVar5 = 0;
    pcVar1 = pcVar3;
    do {
      pcVar2 = pcVar3 + sVar4;
      if ((pcVar3[sVar4] != '}') && (pcVar2 = pcVar1, pcVar3[sVar4] == '{')) {
        if (pcVar1 == pcVar3) {
          asStack_3c0[uVar5 * 2 + 1] = sVar4;
          (&local_3b0)[uVar5 * 2] = pcVar3;
          pcVar2 = pcVar3;
          uVar5 = uVar5 + 1;
        }
        else if (uVar5 < 0x20 && pcVar3 + sVar4 != pcVar1) {
          asStack_3c0[uVar5 * 2 + 1] = (size_t)(pcVar3 + ((sVar4 - 1) - (long)pcVar1));
          (&local_3b0)[uVar5 * 2] = pcVar1 + 1;
          uVar5 = uVar5 + 1;
        }
      }
      sVar4 = sVar4 + 1;
      pcVar1 = pcVar2;
    } while (sVar6 != sVar4);
  }
  pcVar2 = pcVar2 + 1;
  if (pcVar2 != pcVar3 + sVar6) {
    asStack_3c0[uVar5 * 2 + 1] = (long)(pcVar3 + sVar6) - (long)pcVar2;
    (&local_3b0)[uVar5 * 2] = pcVar2;
  }
  asStack_3c0[0] = 0x115d39;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  asStack_3c0[0] = 0x115d52;
  this = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3b0,asStack_3c0[1]);
  asStack_3c0[0] = 0x115d5d;
  ::std::ostream::operator<<((ostream *)this,*ts);
  for (lVar7 = 0x18; lVar7 != 0x208; lVar7 = lVar7 + 0x10) {
    asStack_3c0[0] = 0x115d81;
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,*(char **)((long)asStack_3c0 + lVar7 + 8U),
               *(long *)((long)asStack_3c0 + lVar7));
  }
  asStack_3c0[0] = 0x115d93;
  ::std::__cxx11::stringbuf::str();
  asStack_3c0[0] = 0x115da7;
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  asStack_3c0[0] = 0x115db4;
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string format(std::string_view fmt, auto&&... ts) {
    if (sizeof...(ts) == 0) return std::string(fmt);
    std::array<std::string_view, 32> fragments{};
    if (sizeof...(ts) > fragments.size()) throw std::length_error("format parameters count limit exceeded");
    size_t index = 0;
    auto start = fmt.cbegin(), parser = start;
    while (parser != fmt.cend()) {
        if (*parser == '{') {
            if (start == fmt.cbegin())
                fragments[index++] = std::string_view(start, static_cast<size_t>(parser - start));          /// string_view constructor with iterators is missing in Apple Clang 13
            else if (start != parser && index < fragments.size())
                fragments[index++] = std::string_view(start + 1, static_cast<size_t>(parser - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13
        }
        else if (*parser == '}')
            start = parser;
        ++parser;
    }
    if (start + 1 != fmt.cend()) fragments[index++] = std::string_view(start + 1, static_cast<size_t>(fmt.cend() - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13

    auto frag = fragments.cbegin();
    stringstream ss;
    using webfront::operator<<;
    ((ss << *frag++ << std::forward<decltype(ts)>(ts)), ...);
    while (frag != fragments.cend()) ss << *frag++;
    return ss.str();
}